

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vad_core.c
# Opt level: O2

int WebRtcVad_InitCore(VadInstT *self)

{
  long lVar1;
  
  if (self != (VadInstT *)0x0) {
    self->vad = 1;
    self->downsampling_filter_states[0] = 0;
    self->downsampling_filter_states[1] = 0;
    self->downsampling_filter_states[2] = 0;
    self->downsampling_filter_states[3] = 0;
    self->frame_counter = 0;
    self->over_hang = 0;
    self->num_of_speech = 0;
    WebRtcSpl_ResetResample48khzTo8khz(&self->state_48_to_8);
    for (lVar1 = 0; lVar1 != 0x18; lVar1 = lVar1 + 2) {
      *(undefined2 *)((long)self->noise_means + lVar1) =
           *(undefined2 *)((long)kNoiseDataMeans + lVar1);
      *(undefined2 *)((long)self->speech_means + lVar1) =
           *(undefined2 *)((long)kSpeechDataMeans + lVar1);
      *(undefined2 *)((long)self->noise_stds + lVar1) =
           *(undefined2 *)((long)kNoiseDataStds + lVar1);
      *(undefined2 *)((long)self->speech_stds + lVar1) =
           *(undefined2 *)((long)kSpeechDataStds + lVar1);
    }
    for (lVar1 = -0xc0; lVar1 != 0; lVar1 = lVar1 + 2) {
      *(undefined2 *)((long)self->mean_value + lVar1) = 10000;
      *(undefined2 *)((long)self->low_value_vector + lVar1) = 0;
    }
    self->lower_state[1] = 0;
    self->lower_state[2] = 0;
    self->lower_state[3] = 0;
    self->lower_state[4] = 0;
    self->hp_filter_state[0] = 0;
    self->hp_filter_state[1] = 0;
    self->hp_filter_state[2] = 0;
    self->hp_filter_state[3] = 0;
    self->upper_state[0] = 0;
    self->upper_state[1] = 0;
    self->upper_state[2] = 0;
    self->upper_state[3] = 0;
    *(undefined8 *)(self->upper_state + 4) = 0;
    for (lVar1 = 0; lVar1 != 6; lVar1 = lVar1 + 1) {
      self->mean_value[lVar1] = 0x640;
    }
    self->over_hang_max_1[2] = 3;
    self->over_hang_max_1[0] = 8;
    self->over_hang_max_1[1] = 4;
    self->over_hang_max_2[0] = 0xe;
    self->over_hang_max_2[1] = 7;
    self->over_hang_max_2[2] = 5;
    self->individual[0] = 0x18;
    self->individual[1] = 0x15;
    self->individual[2] = 0x18;
    self->total[0] = 0x39;
    self->total[1] = 0x30;
    self->total[2] = 0x39;
    self->init_flag = 0x2a;
    return 0;
  }
  return -1;
}

Assistant:

int WebRtcVad_InitCore(VadInstT* self) {
  int i;

  if (self == NULL) {
    return -1;
  }

  // Initialization of general struct variables.
  self->vad = 1;  // Speech active (=1).
  self->frame_counter = 0;
  self->over_hang = 0;
  self->num_of_speech = 0;

  // Initialization of downsampling filter state.
  memset(self->downsampling_filter_states, 0,
         sizeof(self->downsampling_filter_states));

  // Initialization of 48 to 8 kHz downsampling.
  WebRtcSpl_ResetResample48khzTo8khz(&self->state_48_to_8);

  // Read initial PDF parameters.
  for (i = 0; i < kTableSize; i++) {
    self->noise_means[i] = kNoiseDataMeans[i];
    self->speech_means[i] = kSpeechDataMeans[i];
    self->noise_stds[i] = kNoiseDataStds[i];
    self->speech_stds[i] = kSpeechDataStds[i];
  }

  // Initialize Index and Minimum value vectors.
  for (i = 0; i < 16 * kNumChannels; i++) {
    self->low_value_vector[i] = 10000;
    self->index_vector[i] = 0;
  }

  // Initialize splitting filter states.
  memset(self->upper_state, 0, sizeof(self->upper_state));
  memset(self->lower_state, 0, sizeof(self->lower_state));

  // Initialize high pass filter states.
  memset(self->hp_filter_state, 0, sizeof(self->hp_filter_state));

  // Initialize mean value memory, for WebRtcVad_FindMinimum().
  for (i = 0; i < kNumChannels; i++) {
    self->mean_value[i] = 1600;
  }

  // Set aggressiveness mode to default (=`kDefaultMode`).
  if (WebRtcVad_set_mode_core(self, kDefaultMode) != 0) {
    return -1;
  }

  self->init_flag = kInitCheck;

  return 0;
}